

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dr_mp3.h
# Opt level: O2

drmp3_uint64
drmp3_src_read_frames_ex
          (drmp3_src *pSRC,drmp3_uint64 frameCount,void *pFramesOut,drmp3_bool32 flush)

{
  byte *pbVar1;
  uint uVar2;
  uint uVar3;
  byte bVar4;
  drmp3_src_algorithm dVar5;
  drmp3_uint64 dVar6;
  drmp3_uint64 dVar7;
  drmp3_uint64 dVar8;
  ulong uVar9;
  ulong uVar10;
  float *pFramesOut_00;
  int iVar11;
  ulong uVar12;
  float fVar13;
  double dVar14;
  
  if (pFramesOut == (void *)0x0 || (frameCount == 0 || pSRC == (drmp3_src *)0x0)) {
    return 0;
  }
  dVar5 = drmp3_src_algorithm_none;
  if ((pSRC->config).sampleRateIn != (pSRC->config).sampleRateOut) {
    dVar5 = (pSRC->config).algorithm;
  }
  if (dVar5 != drmp3_src_algorithm_linear) {
    if (dVar5 != drmp3_src_algorithm_none) {
      return 0;
    }
    dVar6 = (*pSRC->onRead)(pSRC,frameCount,pFramesOut,pSRC->pUserData);
    return dVar6;
  }
  bVar4 = *(byte *)((long)&pSRC->algo + 8);
  if ((bVar4 & 1) == 0) {
    dVar6 = drmp3_src_cache_read_frames(&pSRC->cache,1,pSRC->bin);
    if (dVar6 != 0) {
      bVar4 = *(byte *)((long)&pSRC->algo + 8) | 1;
      *(byte *)((long)&pSRC->algo + 8) = bVar4;
      goto LAB_00106f2f;
    }
LAB_001070e7:
    frameCount = 0;
  }
  else {
LAB_00106f2f:
    if ((bVar4 & 2) == 0) {
      dVar6 = drmp3_src_cache_read_frames(&pSRC->cache,1,pSRC->bin + (pSRC->config).channels);
      if (dVar6 == 0) goto LAB_001070e7;
      pbVar1 = (byte *)((long)&pSRC->algo + 8);
      *pbVar1 = *pbVar1 | 2;
    }
    uVar2 = (pSRC->config).sampleRateIn;
    uVar3 = (pSRC->config).sampleRateOut;
    dVar8 = 0;
    dVar6 = frameCount;
    while (dVar6 != 0) {
      uVar12 = (ulong)(pSRC->config).channels;
      fVar13 = (float)(pSRC->algo).linear.alpha;
      pFramesOut_00 = pSRC->bin + uVar12;
      for (uVar9 = 0; uVar12 != uVar9; uVar9 = uVar9 + 1) {
        *(float *)((long)pFramesOut + uVar9 * 4) =
             pSRC->bin[uVar9] * (1.0 - fVar13) + pFramesOut_00[uVar9] * fVar13;
      }
      dVar14 = (pSRC->algo).linear.alpha + (double)uVar2 / (double)uVar3;
      uVar12 = (ulong)dVar14;
      (pSRC->algo).linear.alpha = dVar14 - (double)(uVar12 & 0xffffffff);
      iVar11 = 0;
      do {
        uVar9 = (ulong)(pSRC->config).channels;
        if (iVar11 == (int)uVar12) {
          bVar4 = *(byte *)((long)&pSRC->algo + 8);
          goto LAB_001070b6;
        }
        for (uVar10 = 0; uVar9 != uVar10; uVar10 = uVar10 + 1) {
          pSRC->bin[uVar10] = pFramesOut_00[uVar10];
        }
        dVar7 = drmp3_src_cache_read_frames(&pSRC->cache,1,pFramesOut_00);
        iVar11 = iVar11 + 1;
      } while (dVar7 != 0);
      uVar9 = (ulong)(pSRC->config).channels;
      for (uVar12 = 0; uVar9 != uVar12; uVar12 = uVar12 + 1) {
        pFramesOut_00[uVar12] = 0.0;
      }
      bVar4 = *(byte *)((long)&pSRC->algo + 8);
      if ((bVar4 & 2) == 0) {
        if (flush != 0) {
          bVar4 = bVar4 & 0xfc;
          *(byte *)((long)&pSRC->algo + 8) = bVar4;
        }
      }
      else {
        bVar4 = bVar4 & 0xfd;
        *(byte *)((long)&pSRC->algo + 8) = bVar4;
      }
LAB_001070b6:
      pFramesOut = (void *)((long)pFramesOut + uVar9 * 4);
      dVar6 = dVar6 - 1;
      dVar8 = dVar8 + 1;
      if ((bVar4 & 2) == 0) {
        if (flush == 0) {
          return dVar8;
        }
        if ((bVar4 & 1) == 0) {
          return dVar8;
        }
      }
    }
  }
  return frameCount;
}

Assistant:

drmp3_uint64 drmp3_src_read_frames_ex(drmp3_src* pSRC, drmp3_uint64 frameCount, void* pFramesOut, drmp3_bool32 flush)
{
    if (pSRC == NULL || frameCount == 0 || pFramesOut == NULL) return 0;

    drmp3_src_algorithm algorithm = pSRC->config.algorithm;

    // Always use passthrough if the sample rates are the same.
    if (pSRC->config.sampleRateIn == pSRC->config.sampleRateOut) {
        algorithm = drmp3_src_algorithm_none;
    }

    // Could just use a function pointer instead of a switch for this...
    switch (algorithm)
    {
        case drmp3_src_algorithm_none:   return drmp3_src_read_frames_passthrough(pSRC, frameCount, pFramesOut, flush);
        case drmp3_src_algorithm_linear: return drmp3_src_read_frames_linear(pSRC, frameCount, pFramesOut, flush);
        default: return 0;
    }
}